

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::CollationFastLatinBuilder::encodeTwoCEs
          (CollationFastLatinBuilder *this,int64_t first,int64_t second)

{
  ushort uVar1;
  ushort uVar2;
  int64_t *list;
  uint16_t *puVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  
  if (first == 0) {
    uVar8 = 0;
  }
  else if (first == 0x101000100) {
    uVar8 = 1;
  }
  else {
    list = (this->uniqueCEs).elements;
    iVar5 = (this->uniqueCEs).count;
    iVar4 = anon_unknown_8::binarySearch(list,iVar5,first & 0xffffffffffff3fff);
    puVar3 = this->miniCEs;
    uVar1 = puVar3[iVar4];
    uVar8 = 1;
    if (uVar1 != 1) {
      uVar7 = 0;
      if (0xfff < uVar1) {
        uVar7 = ((uint)((ulong)first >> 0xb) & 0x18) + 8;
      }
      uVar7 = uVar7 | uVar1;
      uVar8 = uVar7;
      if (second != 0) {
        iVar5 = anon_unknown_8::binarySearch(list,iVar5,second & 0xffffffffffff3fff);
        uVar2 = puVar3[iVar5];
        uVar8 = 1;
        if (uVar2 != 1) {
          if ((((uVar1 < 0x1000) || ((uVar7 & 0x3e0) != 0xa0)) ||
              (uVar6 = uVar2 & 0x3e0, uVar6 < 0x180)) ||
             ((uVar2 & 7) != 0 || (second & 0xc000U) != 0)) {
            uVar6 = 0;
            if (uVar2 - 0x1000 < 0xfffff3e1) {
              uVar6 = (((uint)second & 0xc000) >> 0xb) + 8;
            }
            uVar8 = uVar7 << 0x10 | uVar6 | (uint)uVar2;
          }
          else {
            uVar8 = uVar6 | uVar7 & 0xfc1f;
          }
        }
      }
    }
  }
  return uVar8;
}

Assistant:

uint32_t
CollationFastLatinBuilder::encodeTwoCEs(int64_t first, int64_t second) const {
    if(first == 0) {
        return 0;  // completely ignorable
    }
    if(first == Collation::NO_CE) {
        return CollationFastLatin::BAIL_OUT;
    }
    U_ASSERT((uint32_t)(first >> 32) != Collation::NO_CE_PRIMARY);

    uint32_t miniCE = getMiniCE(first);
    if(miniCE == CollationFastLatin::BAIL_OUT) { return miniCE; }
    if(miniCE >= CollationFastLatin::MIN_SHORT) {
        // Extract & copy the case bits.
        // Shift them from normal CE bits 15..14 to mini CE bits 4..3.
        uint32_t c = (((uint32_t)first & Collation::CASE_MASK) >> (14 - 3));
        // Only in mini CEs: Ignorable case bits = 0, lowercase = 1.
        c += CollationFastLatin::LOWER_CASE;
        miniCE |= c;
    }
    if(second == 0) { return miniCE; }

    uint32_t miniCE1 = getMiniCE(second);
    if(miniCE1 == CollationFastLatin::BAIL_OUT) { return miniCE1; }

    uint32_t case1 = (uint32_t)second & Collation::CASE_MASK;
    if(miniCE >= CollationFastLatin::MIN_SHORT &&
            (miniCE & CollationFastLatin::SECONDARY_MASK) == CollationFastLatin::COMMON_SEC) {
        // Try to combine the two mini CEs into one.
        uint32_t sec1 = miniCE1 & CollationFastLatin::SECONDARY_MASK;
        uint32_t ter1 = miniCE1 & CollationFastLatin::TERTIARY_MASK;
        if(sec1 >= CollationFastLatin::MIN_SEC_HIGH && case1 == 0 &&
                ter1 == CollationFastLatin::COMMON_TER) {
            // sec1>=sec_high implies pri1==0.
            return (miniCE & ~CollationFastLatin::SECONDARY_MASK) | sec1;
        }
    }

    if(miniCE1 <= CollationFastLatin::SECONDARY_MASK || CollationFastLatin::MIN_SHORT <= miniCE1) {
        // Secondary CE, or a CE with a short primary, copy the case bits.
        case1 = (case1 >> (14 - 3)) + CollationFastLatin::LOWER_CASE;
        miniCE1 |= case1;
    }
    return (miniCE << 16) | miniCE1;
}